

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_subx_8_rr(void)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar2);
  uVar3 = (uint)(byte)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  m68ki_cpu.x_flag = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) + ((uVar1 & 0xff) - uVar3);
  m68ki_cpu.v_flag = (m68ki_cpu.x_flag ^ uVar1) & (uVar1 & 0xff ^ uVar3);
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar2) = uVar1 & 0xffffff00 | m68ki_cpu.x_flag & 0xff;
  return;
}

Assistant:

static void m68k_op_subx_8_rr(void)
{
	uint* r_dst = &DX;
	uint src = MASK_OUT_ABOVE_8(DY);
	uint dst = MASK_OUT_ABOVE_8(*r_dst);
	uint res = dst - src - XFLAG_AS_1();

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;
}